

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnTernaryExpr(BinaryReaderIR *this,Opcode opcode)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_28;
  Opcode local_1c;
  _Head_base<0UL,_wabt::Expr_*,_false> local_18;
  
  local_1c.enum_ = opcode.enum_;
  MakeUnique<wabt::OpcodeExpr<(wabt::ExprType)54>,wabt::Opcode&>((wabt *)&local_28,&local_1c);
  local_18._M_head_impl = local_28;
  local_28 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_18);
  if (local_18._M_head_impl != (Expr *)0x0) {
    (*(local_18._M_head_impl)->_vptr_Expr[1])();
  }
  if (local_28 != (Expr *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnTernaryExpr(Opcode opcode) {
  return AppendExpr(MakeUnique<TernaryExpr>(opcode));
}